

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::AddAndOwn
          (SimpleDescriptorDatabase *this,FileDescriptorProto *file)

{
  bool bVar1;
  FileDescriptorProto *local_18;
  FileDescriptorProto *file_local;
  SimpleDescriptorDatabase *this_local;
  
  local_18 = file;
  file_local = (FileDescriptorProto *)this;
  std::
  vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
  ::push_back(&this->files_to_delete_,&local_18);
  bVar1 = DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
                    (&this->index_,local_18,local_18);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::AddAndOwn(const FileDescriptorProto* file) {
  files_to_delete_.push_back(file);
  return index_.AddFile(*file, file);
}